

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall
QDockAreaLayout::resizeDocks
          (QDockAreaLayout *this,QList<QDockWidget_*> *docks,QList<int> *sizes,Orientation o)

{
  bool bVar1;
  QWidget *dockWidget;
  QWidget *pQVar2;
  qsizetype qVar3;
  const_reference piVar4;
  qsizetype qVar5;
  QDockAreaLayoutInfo *pQVar6;
  reference pQVar7;
  const_iterator o_00;
  QDockAreaLayoutItem *pQVar8;
  int *piVar9;
  Orientation in_ECX;
  QList<int> *in_RDX;
  QList<QDockWidget_*> *in_RSI;
  QDockAreaLayout *in_RDI;
  long in_FS_OFFSET;
  QRect *r;
  int dockNum;
  QDockAreaLayoutItem *item;
  add_const_t<QList<QDockAreaLayoutItem>_> *__range4;
  int totalSize;
  QDockAreaLayoutInfo *info;
  int size;
  int i;
  int count;
  QSize s;
  const_iterator __end4;
  const_iterator __begin4;
  QList<int> path;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  Orientation in_stack_fffffffffffffed0;
  Orientation in_stack_fffffffffffffed4;
  QDockAreaLayoutItem *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  QDockAreaLayout *in_stack_fffffffffffffef8;
  int local_e4;
  int local_d4;
  int local_cc;
  const_iterator local_88;
  char local_80 [32];
  char local_60 [32];
  QList<int> local_40;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dockWidget = (QWidget *)QList<QDockWidget_*>::size(in_RSI);
  pQVar2 = (QWidget *)QList<int>::size(in_RDX);
  if (dockWidget == pQVar2) {
    qVar3 = QList<QDockWidget_*>::size(in_RSI);
    in_RDI->fallbackToSizeHints = false;
    for (local_cc = 0; local_cc < (int)qVar3; local_cc = local_cc + 1) {
      local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_40.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
      local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QList<QDockWidget_*>::operator[]
                ((QList<QDockWidget_*> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      indexOf(in_stack_fffffffffffffef8,dockWidget);
      bVar1 = QList<int>::isEmpty((QList<int> *)0x57b8ae);
      if (bVar1) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                   (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        QMessageLogger::warning
                  (local_60,"QMainWidget::resizeDocks: one QDockWidget is not part of the layout");
      }
      else {
        piVar4 = QList<int>::operator[]
                           ((QList<int> *)
                            CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        local_d4 = *piVar4;
        if (local_d4 < 1) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                     ,(char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                     (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          QMessageLogger::warning
                    (local_80,"QMainWidget::resizeDocks: all sizes need to be larger than 0");
          local_d4 = 1;
        }
        while (qVar5 = QList<int>::size(&local_40), 1 < qVar5) {
          pQVar6 = QDockAreaLayout::info
                             (in_RDI,(QList<int> *)
                                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
          if (((pQVar6->tabbed & 1U) == 0) && (pQVar6->o == in_ECX)) {
            in_stack_fffffffffffffed8 = (QDockAreaLayoutItem *)&pQVar6->item_list;
            QList<int>::constLast
                      ((QList<int> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            pQVar7 = QList<QDockAreaLayoutItem>::operator[]
                               ((QList<QDockAreaLayoutItem> *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            pQVar7->size = local_d4;
            local_e4 = 0;
            local_88.i = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
            local_88 = QList<QDockAreaLayoutItem>::begin
                                 ((QList<QDockAreaLayoutItem> *)
                                  CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
            o_00 = QList<QDockAreaLayoutItem>::end
                             ((QList<QDockAreaLayoutItem> *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
            in_stack_fffffffffffffee4 = local_d4;
            while (bVar1 = QList<QDockAreaLayoutItem>::const_iterator::operator!=(&local_88,o_00),
                  bVar1) {
              pQVar8 = QList<QDockAreaLayoutItem>::const_iterator::operator*(&local_88);
              bVar1 = QDockAreaLayoutItem::skip(in_stack_fffffffffffffed8);
              if (!bVar1) {
                if (local_e4 != 0) {
                  local_e4 = in_RDI->sep + local_e4;
                }
                if (pQVar8->size == -1) {
                  in_stack_fffffffffffffed0 = in_ECX;
                  QDockAreaLayoutItem::sizeHint((QDockAreaLayoutItem *)in_RDI);
                  in_stack_fffffffffffffed4 =
                       pick(in_stack_fffffffffffffed4,
                            (QSize *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
                }
                else {
                  in_stack_fffffffffffffed4 = pQVar8->size;
                }
                local_e4 = in_stack_fffffffffffffed4 + local_e4;
              }
              QList<QDockAreaLayoutItem>::const_iterator::operator++(&local_88);
            }
            local_d4 = local_e4;
          }
          QList<int>::removeLast
                    ((QList<int> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        }
        piVar9 = QList<int>::constFirst
                           ((QList<int> *)
                            CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        in_stack_fffffffffffffef8 = (QDockAreaLayout *)&in_RDI->docks[*piVar9].rect;
        QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        piVar9 = rpick(in_stack_fffffffffffffed4,
                       (QSize *)CONCAT44(local_d4,in_stack_fffffffffffffec8));
        *piVar9 = local_d4;
        QRect::setSize((QRect *)in_RDI,
                       (QSize *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        in_stack_fffffffffffffecc = local_d4;
      }
      QList<int>::~QList((QList<int> *)0x57bbde);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QMessageLogger::warning(local_28,"QMainWidget::resizeDocks: size of the lists are not the same")
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::resizeDocks(const QList<QDockWidget *> &docks,
                                  const QList<int> &sizes, Qt::Orientation o)
{
    if (Q_UNLIKELY(docks.size() != sizes.size())) {
        qWarning("QMainWidget::resizeDocks: size of the lists are not the same");
        return;
    }
    int count = docks.size();
    fallbackToSizeHints = false;
    for (int i = 0; i < count; ++i) {
        QList<int> path = indexOf(docks[i]);
        if (Q_UNLIKELY(path.isEmpty())) {
            qWarning("QMainWidget::resizeDocks: one QDockWidget is not part of the layout");
            continue;
        }
        int size = sizes[i];
        if (Q_UNLIKELY(size <= 0)) {
            qWarning("QMainWidget::resizeDocks: all sizes need to be larger than 0");
            size = 1;
        }

        while (path.size() > 1) {
            QDockAreaLayoutInfo *info = this->info(path);
#if QT_CONFIG(tabbar)
            if (!info->tabbed && info->o == o) {
                info->item_list[path.constLast()].size = size;
                int totalSize = 0;
                for (const QDockAreaLayoutItem &item : std::as_const(info->item_list)) {
                    if (!item.skip()) {
                        if (totalSize != 0)
                            totalSize += sep;
                        totalSize += item.size == -1 ? pick(o, item.sizeHint()) : item.size;
                    }
                }
                size = totalSize;
            }
#endif // QT_CONFIG(tabbar)
            path.removeLast();
        }

        const int dockNum = path.constFirst();
        Q_ASSERT(dockNum < QInternal::DockCount);
        QRect &r = this->docks[dockNum].rect;
        QSize s = r.size();
        rpick(o, s) = size;
        r.setSize(s);
    }
}